

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O2

void cereal::
     load<cereal::BinaryInputArchive,eos::morphablemodel::PcaModel,std::vector<eos::morphablemodel::Blendshape,std::allocator<eos::morphablemodel::Blendshape>>>
               (BinaryInputArchive *ar,
               variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>
               *variant)

{
  Exception *this;
  int32_t index;
  
  InputArchive<cereal::BinaryInputArchive,1u>::operator()
            ((InputArchive<cereal::BinaryInputArchive,1u> *)ar,&index);
  if (index < 2) {
    std::enable_if<(0)<(std::variant_size_v<std::variant<eos::morphablemodel::PcaModel,std::
    vector<eos::morphablemodel::Blendshape,std::allocator<eos::morphablemodel::Blendshape>>>>),void>
    ::type_cereal::variant_detail::load_variant<0,std::variant<eos::morphablemodel::PcaModel,std::
    vector<eos::morphablemodel::Blendshape,std::allocator<eos::morphablemodel::Blendshape>>>,cereal
    ::BinaryInputArchive>(ar,index,variant);
    return;
  }
  this = (Exception *)__cxa_allocate_exception(0x10);
  Exception::Exception(this,"Invalid \'index\' selector when deserializing std::variant");
  __cxa_throw(this,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline
  void CEREAL_LOAD_FUNCTION_NAME( Archive & ar, std::variant<VariantTypes...> & variant )
  {
    using variant_t = typename std::variant<VariantTypes...>;

    std::int32_t index;
    ar( CEREAL_NVP_("index", index) );
    if(index >= static_cast<std::int32_t>(std::variant_size_v<variant_t>))
      throw Exception("Invalid 'index' selector when deserializing std::variant");

    variant_detail::load_variant<0>(ar, index, variant);
  }